

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

int nifti_datatype_is_valid(int dtype,int for_nifti)

{
  nifti_type_ele *pnVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  
  iVar2 = 0;
  if (dtype != 1 || for_nifti == 0) {
    uVar3 = 0x2a;
    uVar4 = 0x2a;
    do {
      bVar5 = uVar3 == 0;
      uVar3 = uVar3 - 1;
      if (bVar5) {
        return 0;
      }
      pnVar1 = nifti_type_list + uVar4;
      uVar4 = (ulong)uVar3;
    } while (pnVar1->type != dtype);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int nifti_datatype_is_valid( int dtype, int for_nifti )
{
    int tablen = sizeof(nifti_type_list)/sizeof(nifti_type_ele);
    int c;

    /* special case */
    if( for_nifti && dtype == DT_BINARY ) return 0;

    for( c = tablen-1; c > 0; c-- )
        if( nifti_type_list[c].type == dtype )
            return 1;

    return 0;
}